

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::mergeErrorCheck
          (TIntermediate *this,TInfoSink *infoSink,TIntermSymbol *symbol,TIntermSymbol *unitSymbol)

{
  TType *pTVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  TIntermSymbol *pTVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  TInfoSinkBase *pTVar12;
  undefined4 extraout_var_19;
  TString *pTVar13;
  char *pcVar14;
  undefined4 extraout_var_20;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar15;
  const_reference pvVar16;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  TTypeList *pTVar17;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  ulong uVar18;
  undefined4 extraout_var_42;
  size_type sVar19;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  undefined4 extraout_var_85;
  undefined4 extraout_var_86;
  undefined4 extraout_var_87;
  undefined4 extraout_var_88;
  undefined4 extraout_var_89;
  undefined4 extraout_var_90;
  undefined4 extraout_var_91;
  undefined4 extraout_var_92;
  undefined4 extraout_var_93;
  undefined4 extraout_var_94;
  undefined4 extraout_var_95;
  undefined4 extraout_var_96;
  undefined4 extraout_var_97;
  undefined4 extraout_var_98;
  undefined4 extraout_var_99;
  undefined4 extraout_var_x00100;
  undefined4 extraout_var_x00101;
  undefined4 extraout_var_x00102;
  undefined4 extraout_var_x00103;
  undefined4 extraout_var_x00104;
  undefined4 extraout_var_x00105;
  undefined4 extraout_var_x00106;
  undefined4 extraout_var_x00107;
  undefined4 extraout_var_x00108;
  undefined4 extraout_var_x00109;
  undefined4 extraout_var_x00110;
  undefined4 extraout_var_x00111;
  undefined4 extraout_var_x00112;
  undefined4 extraout_var_x00113;
  undefined4 extraout_var_x00114;
  undefined4 extraout_var_x00115;
  undefined4 extraout_var_x00116;
  undefined4 extraout_var_x00117;
  undefined4 extraout_var_x00118;
  undefined4 extraout_var_x00119;
  undefined4 extraout_var_x00120;
  undefined4 extraout_var_x00121;
  undefined4 extraout_var_x00122;
  undefined4 extraout_var_x00123;
  undefined4 extraout_var_x00124;
  undefined4 extraout_var_x00125;
  undefined4 extraout_var_x00126;
  undefined4 extraout_var_x00127;
  undefined4 extraout_var_x00128;
  undefined4 extraout_var_x00129;
  undefined4 extraout_var_x00130;
  undefined4 extraout_var_x00131;
  undefined4 extraout_var_x00132;
  undefined4 extraout_var_x00133;
  undefined4 extraout_var_x00134;
  TConstUnionArray *pTVar20;
  TConstUnionArray *rhs;
  undefined4 extraout_var_x00135;
  undefined4 extraout_var_x00136;
  undefined4 extraout_var_x00137;
  undefined4 extraout_var_x00138;
  undefined4 extraout_var_x00139;
  undefined4 extraout_var_x00140;
  undefined4 extraout_var_x00141;
  undefined4 extraout_var_x00142;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar21;
  undefined4 extraout_var_x00143;
  undefined4 extraout_var_x00144;
  undefined4 extraout_var_x00145;
  undefined4 extraout_var_x00146;
  undefined4 extraout_var_x00147;
  undefined4 extraout_var_x00148;
  undefined4 extraout_var_x00149;
  undefined4 extraout_var_x00150;
  undefined4 extraout_var_x00151;
  undefined4 extraout_var_x00152;
  undefined4 extraout_var_x00153;
  undefined4 extraout_var_x00154;
  undefined4 extraout_var_x00155;
  undefined4 extraout_var_x00156;
  undefined4 extraout_var_x00157;
  undefined4 extraout_var_x00158;
  undefined4 extraout_var_x00159;
  bool local_86b;
  bool local_86a;
  bool local_869;
  byte local_72a;
  byte local_729;
  byte local_719;
  byte local_711;
  int local_710;
  uint local_70c;
  pool_allocator<char> local_700;
  TString local_6f8;
  pool_allocator<char> local_6d0;
  TString local_6c8;
  TString local_6a0;
  pool_allocator<char> local_678;
  TString local_670;
  pool_allocator<char> local_648;
  TString local_640;
  TString local_618;
  pool_allocator<char> local_5f0;
  TString local_5e8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_5c0;
  TString local_598;
  pool_allocator<char> local_570;
  TString local_568;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_540;
  TString local_518;
  pool_allocator<char> local_4f0;
  TString local_4e8;
  pool_allocator<char> local_4c0;
  TString local_4b8;
  TString local_490;
  pool_allocator<char> local_468;
  TString local_460;
  pool_allocator<char> local_438;
  TString local_430;
  TString local_408;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_3b8;
  TString local_390;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_340;
  TString local_318;
  byte local_2eb;
  byte local_2ea;
  bool local_2e9;
  bool layoutQualifierError;
  bool memoryQualifierError;
  bool isInOut;
  TString local_2e0;
  pool_allocator<char> local_2b8;
  TString local_2b0;
  TString local_288;
  pool_allocator<char> local_260;
  TString local_258;
  pool_allocator<char> local_230;
  TString local_228;
  TString local_200;
  bool local_1d1;
  long lStack_1d0;
  bool layoutQualifierError_1;
  TQualifier *unitQualifier;
  TQualifier *qualifier;
  uint ri;
  uint li;
  undefined1 local_1b0 [8];
  TString errmsg_1;
  undefined1 local_180 [8];
  TString errmsg;
  TString local_150;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_128;
  TString local_100;
  pool_allocator<char> local_d8;
  TString local_d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a8;
  TString local_80;
  int local_54;
  int local_50;
  int rpidx;
  int lpidx;
  uint i;
  uint unitNumDim;
  uint unitFirstDim;
  uint numDim;
  uint firstDim;
  bool arraysMatch;
  bool printType;
  EShLanguage EStack_30;
  bool printPrecision;
  bool printQualifiers;
  bool errorReported;
  bool writeTypeComparison;
  bool crossStage;
  EShLanguage unitStage;
  EShLanguage stage;
  TIntermSymbol *unitSymbol_local;
  TIntermSymbol *symbol_local;
  TInfoSink *infoSink_local;
  TIntermediate *this_local;
  
  _unitStage = unitSymbol;
  unitSymbol_local = symbol;
  symbol_local = (TIntermSymbol *)infoSink;
  infoSink_local = (TInfoSink *)this;
  _printQualifiers = TIntermSymbol::getStage(symbol);
  EStack_30 = TIntermSymbol::getStage(_unitStage);
  firstDim._3_1_ = _printQualifiers != EStack_30;
  firstDim._2_1_ = 0;
  firstDim._1_1_ = 0;
  firstDim._0_1_ = 0;
  numDim._3_1_ = 0;
  numDim._2_1_ = 0;
  numDim._1_1_ = 0;
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  bVar6 = isIoResizeArray((TType *)CONCAT44(extraout_var,iVar9),_printQualifiers);
  if (bVar6) {
LAB_0052ad21:
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    bVar6 = isIoResizeArray((TType *)CONCAT44(extraout_var_01,iVar9),_printQualifiers);
    unitFirstDim = (uint)bVar6;
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
    if (CONCAT44(extraout_var_02,iVar9) == 0) {
      local_70c = 0;
    }
    else {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
      local_70c = TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_03,iVar9));
    }
    unitNumDim = local_70c;
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    bVar6 = isIoResizeArray((TType *)CONCAT44(extraout_var_04,iVar9),EStack_30);
    i = (uint)bVar6;
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
    if (CONCAT44(extraout_var_05,iVar9) == 0) {
      local_710 = 0;
    }
    else {
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
      local_710 = TArraySizes::getNumDims((TArraySizes *)CONCAT44(extraout_var_06,iVar9));
    }
    lpidx = local_710;
    numDim._1_1_ = unitNumDim - unitFirstDim == local_710 - i;
    rpidx = 0;
    while( true ) {
      local_711 = 0;
      if ((uint)rpidx < unitNumDim - unitFirstDim) {
        local_711 = numDim._1_1_;
      }
      if ((local_711 & 1) == 0) goto LAB_0052affc;
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
      iVar9 = TArraySizes::getDimSize
                        ((TArraySizes *)CONCAT44(extraout_var_07,iVar9),unitFirstDim + rpidx);
      iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
      iVar10 = TArraySizes::getDimSize((TArraySizes *)CONCAT44(extraout_var_08,iVar10),i + rpidx);
      if (iVar9 != iVar10) break;
      rpidx = rpidx + 1;
    }
    numDim._1_1_ = 0;
  }
  else {
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    bVar6 = isIoResizeArray((TType *)CONCAT44(extraout_var_00,iVar9),EStack_30);
    if (bVar6) goto LAB_0052ad21;
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    bVar6 = TType::sameArrayness
                      ((TType *)CONCAT44(extraout_var_09,iVar9),
                       (TType *)CONCAT44(extraout_var_10,iVar10));
    local_719 = 1;
    if (!bVar6) {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar9) + 0xe8))();
      local_729 = 0;
      if ((uVar11 & 1) != 0) {
        iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        uVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0xe8))();
        local_729 = 0;
        if ((uVar11 & 1) != 0) {
          iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                  )();
          bVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar9) + 0x100))();
          local_72a = 1;
          if ((bVar7 & 1) == 0) {
            iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
            bVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar9) + 0x100))();
            local_72a = 1;
            if ((bVar7 & 1) == 0) {
              iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                        [0x1e])();
              bVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar9) + 0xf8))();
              local_72a = 1;
              if ((bVar7 & 1) == 0) {
                iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                        )();
                local_72a = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar9) + 0xf8))();
              }
            }
          }
          local_729 = local_72a;
        }
      }
      local_719 = local_729;
    }
    numDim._1_1_ = local_719 & 1;
  }
LAB_0052affc:
  local_50 = -1;
  local_54 = -1;
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  bVar6 = TType::sameElementType
                    ((TType *)CONCAT44(extraout_var_17,iVar9),
                     (TType *)CONCAT44(extraout_var_18,iVar10),&local_50,&local_54);
  if (bVar6) {
    if ((numDim._1_1_ & 1) == 0) {
      error(this,(TInfoSink *)symbol_local,"Array sizes must be compatible:",EStack_30);
      firstDim._2_1_ = 1;
      numDim._2_1_ = 1;
    }
    else {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      bVar6 = TType::sameTypeParameters
                        ((TType *)CONCAT44(extraout_var_34,iVar9),
                         (TType *)CONCAT44(extraout_var_35,iVar10));
      if (!bVar6) {
        error(this,(TInfoSink *)symbol_local,"Type parameters must match:",EStack_30);
        firstDim._2_1_ = 1;
        numDim._2_1_ = 1;
      }
    }
  }
  else if ((local_50 < 0) || (local_54 < 0)) {
    if ((local_50 < 0) || (local_54 != -1)) {
      if ((local_50 == -1) && (-1 < local_54)) {
        pcVar14 = StageName(EStack_30);
        pool_allocator<char>::pool_allocator((pool_allocator<char> *)&ri);
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   local_1b0,pcVar14,(pool_allocator<char> *)&ri);
        pbVar21 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                            ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_1b0," block member has no corresponding member in ");
        pcVar14 = StageName(_printQualifiers);
        pbVar21 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                            (pbVar21,pcVar14);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(pbVar21," block:");
        pTVar5 = symbol_local;
        pcVar14 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                            ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_1b0);
        error(this,(TInfoSink *)pTVar5,pcVar14,EStack_30);
        pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
        pcVar14 = StageName(EStack_30);
        pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
        pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
        iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        pTVar13 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar9) + 0x28))();
        pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
        pTVar12 = TInfoSinkBase::operator<<(pTVar12,", Member: ");
        iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_31,iVar9))->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
        pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                  operator[](pvVar15,(long)local_54);
        iVar9 = (*pvVar16->type->_vptr_TType[6])();
        pTVar12 = TInfoSinkBase::operator<<(pTVar12,(TString *)CONCAT44(extraout_var_32,iVar9));
        TInfoSinkBase::operator<<(pTVar12,"\n");
        pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
        pcVar14 = StageName(_printQualifiers);
        pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
        pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
        iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          ();
        pTVar13 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_33,iVar9) + 0x28))();
        pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
        TInfoSinkBase::operator<<(pTVar12,", Member: n/a \n");
        firstDim._1_1_ = 1;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      local_1b0);
      }
      else {
        error(this,(TInfoSink *)symbol_local,"Types must match:",EStack_30);
        firstDim._2_1_ = 1;
        numDim._2_1_ = 1;
      }
    }
    else {
      pcVar14 = StageName(_printQualifiers);
      pool_allocator<char>::pool_allocator((pool_allocator<char> *)((long)&errmsg_1.field_2 + 8));
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 local_180,pcVar14,(pool_allocator<char> *)((long)&errmsg_1.field_2 + 8));
      pbVar21 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)local_180," block member has no corresponding member in ");
      pcVar14 = StageName(EStack_30);
      pbVar21 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                          (pbVar21,pcVar14);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(pbVar21," block:");
      pTVar5 = symbol_local;
      pcVar14 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)local_180);
      error(this,(TInfoSink *)pTVar5,pcVar14,EStack_30);
      pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
      pcVar14 = StageName(_printQualifiers);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      pTVar13 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_26,iVar9) + 0x28))();
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,", Member: ");
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_27,iVar9))->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                operator[](pvVar15,(long)local_50);
      iVar9 = (*pvVar16->type->_vptr_TType[6])();
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,(TString *)CONCAT44(extraout_var_28,iVar9));
      TInfoSinkBase::operator<<(pTVar12,"\n");
      pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
      pcVar14 = StageName(EStack_30);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      pTVar13 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_29,iVar9) + 0x28))();
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
      TInfoSinkBase::operator<<(pTVar12,", Member: n/a \n");
      firstDim._1_1_ = 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_180);
    }
  }
  else {
    error(this,(TInfoSink *)symbol_local,"Member names and types must match:",EStack_30);
    pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    Block: ");
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pTVar13 = (TString *)(**(code **)(*(long *)CONCAT44(extraout_var_19,iVar9) + 0x28))();
    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
    TInfoSinkBase::operator<<(pTVar12,"\n");
    pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"        ");
    pcVar14 = StageName(_printQualifiers);
    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
    pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: \"");
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_20,iVar9))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](pvVar15,(long)local_50);
    pTVar1 = pvVar16->type;
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_21,iVar9))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](pvVar15,(long)local_50);
    iVar9 = (*pvVar16->type->_vptr_TType[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_22,iVar9));
    pool_allocator<char>::pool_allocator(&local_d8);
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_d0,
               "",&local_d8);
    TType::getCompleteString(&local_80,pTVar1,true,false,false,true,&local_a8,&local_d0);
    pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_80);
    TInfoSinkBase::operator<<(pTVar12,"\"\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_a8);
    pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"        ");
    pcVar14 = StageName(EStack_30);
    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
    pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: \"");
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_23,iVar9))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](pvVar15,(long)local_54);
    pTVar1 = pvVar16->type;
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_24,iVar9))->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
              operator[](pvVar15,(long)local_54);
    iVar9 = (*pvVar16->type->_vptr_TType[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string(&local_128,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_25,iVar9));
    pool_allocator<char>::pool_allocator((pool_allocator<char> *)((long)&errmsg.field_2 + 8));
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_150
               ,"",(pool_allocator<char> *)((long)&errmsg.field_2 + 8));
    TType::getCompleteString(&local_100,pTVar1,true,false,false,true,&local_128,&local_150);
    pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_100);
    TInfoSinkBase::operator<<(pTVar12,"\"\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_100);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_150);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string(&local_128);
    firstDim._1_1_ = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_36,iVar9) + 0x38))();
  if (iVar9 == 0x10) {
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_37,iVar9) + 0x38))();
    if (iVar9 == 0x10) {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      pTVar17 = TType::getStruct((TType *)CONCAT44(extraout_var_38,iVar9));
      if (pTVar17 != (TTypeList *)0x0) {
        iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
        pTVar17 = TType::getStruct((TType *)CONCAT44(extraout_var_39,iVar9));
        if (pTVar17 != (TTypeList *)0x0) {
          iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                  )();
          iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          bVar6 = TType::sameStructType
                            ((TType *)CONCAT44(extraout_var_40,iVar9),
                             (TType *)CONCAT44(extraout_var_41,iVar10),(int *)0x0,(int *)0x0);
          if (bVar6) {
            qualifier._4_4_ = 0;
            qualifier._0_4_ = 0;
            while( true ) {
              uVar18 = (ulong)qualifier._4_4_;
              iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                        [0x1e])();
              pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_42,iVar9))->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ;
              sVar19 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                       size(pvVar15);
              bVar6 = false;
              if (uVar18 < sVar19) {
                uVar18 = (ulong)(uint)qualifier;
                iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                        )();
                pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_43,iVar9))->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                ;
                sVar19 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                         ::size(pvVar15);
                bVar6 = uVar18 < sVar19;
              }
              if (!bVar6) break;
              iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                        [0x1e])();
              pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_44,iVar9))->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ;
              pvVar16 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ::operator[](pvVar15,(ulong)qualifier._4_4_);
              uVar11 = (*pvVar16->type->_vptr_TType[3])();
              if ((uVar11 & 1) == 0) {
                iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e]
                        )();
                pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_45,iVar9))->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                ;
                pvVar16 = std::
                          vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                          operator[](pvVar15,(ulong)(uint)qualifier);
                uVar11 = (*pvVar16->type->_vptr_TType[3])();
                if ((uVar11 & 1) == 0) {
                  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode.
                            _vptr_TIntermNode[0x1e])();
                  pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_46,iVar9))->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ;
                  pvVar16 = std::
                            vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                            operator[](pvVar15,(ulong)qualifier._4_4_);
                  iVar9 = (*pvVar16->type->_vptr_TType[10])();
                  unitQualifier = (TQualifier *)CONCAT44(extraout_var_47,iVar9);
                  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                            [0x1e])();
                  pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_48,iVar9))->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                  ;
                  pvVar16 = std::
                            vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                            operator[](pvVar15,(ulong)(uint)qualifier);
                  iVar9 = (*pvVar16->type->_vptr_TType[10])();
                  lStack_1d0 = CONCAT44(extraout_var_49,iVar9);
                  local_1d1 = false;
                  bVar6 = (uint)((ulong)*(undefined8 *)&unitQualifier->field_0x8 >> 0x3d) !=
                          (uint)((ulong)*(undefined8 *)(lStack_1d0 + 8) >> 0x3d);
                  if (bVar6) {
                    error(this,(TInfoSink *)symbol_local,
                          "Interface block member layout matrix qualifier must match:",EStack_30);
                  }
                  bVar8 = unitQualifier->layoutOffset != *(int *)(lStack_1d0 + 0x14);
                  if (bVar8) {
                    local_1d1 = bVar6;
                    error(this,(TInfoSink *)symbol_local,
                          "Interface block member layout offset qualifier must match:",EStack_30);
                  }
                  local_1d1 = bVar8 || bVar6;
                  if (unitQualifier->layoutAlign != *(int *)(lStack_1d0 + 0x18)) {
                    error(this,(TInfoSink *)symbol_local,
                          "Interface block member layout align qualifier must match:",EStack_30);
                    local_1d1 = true;
                  }
                  if (((uint)*(undefined8 *)&unitQualifier->field_0x1c & 0xfff) !=
                      ((uint)*(undefined8 *)(lStack_1d0 + 0x1c) & 0xfff)) {
                    error(this,(TInfoSink *)symbol_local,
                          "Interface block member layout location qualifier must match:",EStack_30);
                    local_1d1 = true;
                  }
                  if (((uint)(*(ulong *)&unitQualifier->field_0x1c >> 0xc) & 7) !=
                      ((uint)(*(ulong *)(lStack_1d0 + 0x1c) >> 0xc) & 7)) {
                    error(this,(TInfoSink *)symbol_local,
                          "Interface block member layout component qualifier must match:",EStack_30)
                    ;
                    local_1d1 = true;
                  }
                  if (local_1d1 != false) {
                    pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
                    pcVar14 = StageName(_printQualifiers);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
                    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode.
                              _vptr_TIntermNode[0x1e])();
                    pTVar13 = (TString *)
                              (**(code **)(*(long *)CONCAT44(extraout_var_50,iVar9) + 0x28))();
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,", Member: ");
                    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode.
                              _vptr_TIntermNode[0x1e])();
                    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_51,iVar9))->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ;
                    pvVar16 = std::
                              vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ::operator[](pvVar15,(ulong)qualifier._4_4_);
                    iVar9 = (*pvVar16->type->_vptr_TType[6])();
                    pTVar12 = TInfoSinkBase::operator<<
                                        (pTVar12,(TString *)CONCAT44(extraout_var_52,iVar9));
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12," \"");
                    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode.
                              _vptr_TIntermNode[0x1e])();
                    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_53,iVar9))->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ;
                    pvVar16 = std::
                              vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ::operator[](pvVar15,(ulong)qualifier._4_4_);
                    pTVar1 = pvVar16->type;
                    pool_allocator<char>::pool_allocator(&local_230);
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    basic_string<glslang::std::allocator<char>>
                              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                *)&local_228,"",&local_230);
                    pool_allocator<char>::pool_allocator(&local_260);
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    basic_string<glslang::std::allocator<char>>
                              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                *)&local_258,"",&local_260);
                    TType::getCompleteString
                              (&local_200,pTVar1,true,true,false,false,&local_228,&local_258);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_200);
                    TInfoSinkBase::operator<<(pTVar12,"\"\n");
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string(&local_200);
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string(&local_258);
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string(&local_228);
                    pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
                    pcVar14 = StageName(EStack_30);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
                    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                              [0x1e])();
                    pTVar13 = (TString *)
                              (**(code **)(*(long *)CONCAT44(extraout_var_54,iVar9) + 0x28))();
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,", Member: ");
                    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                              [0x1e])();
                    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_55,iVar9))->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ;
                    pvVar16 = std::
                              vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ::operator[](pvVar15,(ulong)(uint)qualifier);
                    iVar9 = (*pvVar16->type->_vptr_TType[6])();
                    pTVar12 = TInfoSinkBase::operator<<
                                        (pTVar12,(TString *)CONCAT44(extraout_var_56,iVar9));
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12," \"");
                    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                              [0x1e])();
                    pvVar15 = &TType::getStruct((TType *)CONCAT44(extraout_var_57,iVar9))->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ;
                    pvVar16 = std::
                              vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ::operator[](pvVar15,(ulong)(uint)qualifier);
                    pTVar1 = pvVar16->type;
                    pool_allocator<char>::pool_allocator(&local_2b8);
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    basic_string<glslang::std::allocator<char>>
                              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                *)&local_2b0,"",&local_2b8);
                    pool_allocator<char>::pool_allocator
                              ((pool_allocator<char> *)&stack0xfffffffffffffd18);
                    std::__cxx11::
                    basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                    basic_string<glslang::std::allocator<char>>
                              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                *)&local_2e0,"",(pool_allocator<char> *)&stack0xfffffffffffffd18);
                    TType::getCompleteString
                              (&local_288,pTVar1,true,true,false,false,&local_2b0,&local_2e0);
                    pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_288);
                    TInfoSinkBase::operator<<(pTVar12,"\"\n");
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string(&local_288);
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string(&local_2e0);
                    std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    ~basic_string(&local_2b0);
                    firstDim._1_1_ = 1;
                  }
                  qualifier._4_4_ = qualifier._4_4_ + 1;
                  qualifier._0_4_ = (uint)qualifier + 1;
                }
                else {
                  qualifier._0_4_ = (uint)qualifier + 1;
                }
              }
              else {
                qualifier._4_4_ = qualifier._4_4_ + 1;
              }
            }
          }
        }
      }
    }
  }
  local_869 = false;
  if ((firstDim._3_1_ & 1) != 0) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_58,iVar9) + 8) & 0x7f) == 3) {
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      local_86a = true;
      if (((uint)*(undefined8 *)(CONCAT44(extraout_var_59,iVar9) + 8) & 0x7f) != 4)
      goto LAB_0052bfe2;
    }
    else {
LAB_0052bfe2:
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      local_86b = false;
      if (((uint)*(undefined8 *)(CONCAT44(extraout_var_60,iVar9) + 8) & 0x7f) == 4) {
        iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
        local_86b = ((uint)*(undefined8 *)(CONCAT44(extraout_var_61,iVar9) + 8) & 0x7f) == 3;
      }
      local_86a = local_86b;
    }
    local_869 = local_86a;
  }
  local_2e9 = local_869;
  if (local_869 == false) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar2 = *(undefined8 *)(CONCAT44(extraout_var_62,iVar9) + 8);
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((uint)uVar2 & 0x7f) != ((uint)*(undefined8 *)(CONCAT44(extraout_var_63,iVar9) + 8) & 0x7f))
    {
      error(this,(TInfoSink *)symbol_local,"Storage qualifiers must match:",EStack_30);
      firstDim._2_1_ = 1;
      firstDim._0_1_ = 1;
    }
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar6 = TQualifier::isUniformOrBuffer((TQualifier *)CONCAT44(extraout_var_64,iVar9));
  if (bVar6) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    bVar6 = IsAnonymous((TString *)CONCAT44(extraout_var_65,iVar9));
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    bVar8 = IsAnonymous((TString *)CONCAT44(extraout_var_66,iVar9));
    if (bVar6 != bVar8) {
      error(this,(TInfoSink *)symbol_local,
            "Matched Uniform or Storage blocks must all be anonymous, or all be named:",EStack_30);
      firstDim._2_1_ = 1;
    }
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_67,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uint)uVar2 & 0x7f) == ((uint)*(undefined8 *)(CONCAT44(extraout_var_68,iVar9) + 8) & 0x7f)) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    bVar6 = IsAnonymous((TString *)CONCAT44(extraout_var_69,iVar9));
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    bVar8 = IsAnonymous((TString *)CONCAT44(extraout_var_70,iVar9));
    if (bVar6 == bVar8) {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      bVar6 = IsAnonymous((TString *)CONCAT44(extraout_var_71,iVar9));
      if (!bVar6) {
        iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                          ();
        iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_72,iVar9),
                                (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)CONCAT44(extraout_var_73,iVar10));
        if (bVar6) goto LAB_0052c20c;
      }
    }
    else {
LAB_0052c20c:
      warn(this,(TInfoSink *)symbol_local,
           "Matched shader interfaces are using different instance names.",EStack_30);
      firstDim._2_1_ = 1;
    }
  }
  if ((local_2e9 & 1U) == 0) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar18 = *(ulong *)(CONCAT44(extraout_var_74,iVar9) + 8);
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((uint)(uVar18 >> 0x19) & 7) !=
        ((uint)(*(ulong *)(CONCAT44(extraout_var_75,iVar9) + 8) >> 0x19) & 7)) {
      error(this,(TInfoSink *)symbol_local,"Precision qualifiers must match:",EStack_30);
      firstDim._2_1_ = 1;
      numDim._3_1_ = 1;
    }
  }
  if ((firstDim._3_1_ & 1) == 0) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar18 = *(ulong *)(CONCAT44(extraout_var_76,iVar9) + 8);
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((byte)(uVar18 >> 0x1c) & 1) !=
        ((byte)(*(ulong *)(CONCAT44(extraout_var_77,iVar9) + 8) >> 0x1c) & 1)) {
      error(this,(TInfoSink *)symbol_local,"Presence of invariant qualifier must match:",EStack_30);
      firstDim._2_1_ = 1;
      firstDim._0_1_ = 1;
    }
  }
  if ((firstDim._3_1_ & 1) == 0) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    bVar6 = TQualifier::isNoContraction((TQualifier *)CONCAT44(extraout_var_78,iVar9));
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    bVar8 = TQualifier::isNoContraction((TQualifier *)CONCAT44(extraout_var_79,iVar9));
    if (bVar6 != bVar8) {
      error(this,(TInfoSink *)symbol_local,"Presence of precise qualifier must match:",EStack_30);
      firstDim._2_1_ = 1;
      numDim._3_1_ = 1;
    }
  }
  if ((firstDim._3_1_ & 1) == 0) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar18 = *(ulong *)(CONCAT44(extraout_var_80,iVar9) + 8);
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((byte)(uVar18 >> 0x1d) & 1) ==
        ((byte)(*(ulong *)(CONCAT44(extraout_var_81,iVar9) + 8) >> 0x1d) & 1)) {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      uVar18 = *(ulong *)(CONCAT44(extraout_var_82,iVar9) + 8);
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      if (((byte)(uVar18 >> 0x1e) & 1) ==
          ((byte)(*(ulong *)(CONCAT44(extraout_var_83,iVar9) + 8) >> 0x1e) & 1)) {
        iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                          ();
        uVar18 = *(ulong *)(CONCAT44(extraout_var_84,iVar9) + 8);
        iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
        if (((byte)(uVar18 >> 0x1f) & 1) ==
            ((byte)(*(ulong *)(CONCAT44(extraout_var_85,iVar9) + 8) >> 0x1f) & 1)) {
          iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22]
                  )();
          bVar6 = TQualifier::isSample((TQualifier *)CONCAT44(extraout_var_86,iVar9));
          iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
          bVar8 = TQualifier::isSample((TQualifier *)CONCAT44(extraout_var_87,iVar9));
          if (bVar6 == bVar8) {
            iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                      [0x22])();
            bVar6 = TQualifier::isPatch((TQualifier *)CONCAT44(extraout_var_88,iVar9));
            iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
            bVar8 = TQualifier::isPatch((TQualifier *)CONCAT44(extraout_var_89,iVar9));
            if (bVar6 == bVar8) {
              iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                        [0x22])();
              bVar6 = TQualifier::isNonPerspective((TQualifier *)CONCAT44(extraout_var_90,iVar9));
              iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                ();
              bVar8 = TQualifier::isNonPerspective((TQualifier *)CONCAT44(extraout_var_91,iVar9));
              if (bVar6 == bVar8) goto LAB_0052c582;
            }
          }
        }
      }
    }
    error(this,(TInfoSink *)symbol_local,
          "Interpolation and auxiliary storage qualifiers must match:",EStack_30);
    firstDim._2_1_ = 1;
    firstDim._0_1_ = 1;
  }
LAB_0052c582:
  local_2ea = 0;
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_92,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x31) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_93,iVar9) + 8) >> 0x31) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory coherent qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_94,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x34) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_95,iVar9) + 8) >> 0x34) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory devicecoherent qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_96,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x35) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_97,iVar9) + 8) >> 0x35) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory queuefamilycoherent qualifier must match:",
          EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_98,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x36) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_99,iVar9) + 8) >> 0x36) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory workgroupcoherent qualifier must match:",EStack_30)
    ;
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_x00100,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x37) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_x00101,iVar9) + 8) >> 0x37) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory subgroupcoherent qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00102,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)((ulong)uVar2 >> 0x38) & 1) !=
      ((byte)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00103,iVar9) + 8) >> 0x38) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory shadercallcoherent qualifier must match:",EStack_30
         );
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00104,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)((ulong)uVar2 >> 0x39) & 1) !=
      ((byte)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00105,iVar9) + 8) >> 0x39) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory nonprivate qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_x00106,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x32) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_x00107,iVar9) + 8) >> 0x32) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory volatil qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_x00108,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x33) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_x00109,iVar9) + 8) >> 0x33) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory nontemporal qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_x00110,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x2e) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_x00111,iVar9) + 8) >> 0x2e) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory restrict qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_x00112,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)(uVar18 >> 0x2f) & 1) !=
      ((byte)(*(ulong *)(CONCAT44(extraout_var_x00113,iVar9) + 8) >> 0x2f) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory readonly qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00114,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((byte)((ulong)uVar2 >> 0x30) & 1) !=
      ((byte)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00115,iVar9) + 8) >> 0x30) & 1)) {
    error(this,(TInfoSink *)symbol_local,"Memory writeonly qualifier must match:",EStack_30);
    local_2ea = 1;
  }
  if ((local_2ea & 1) != 0) {
    firstDim._2_1_ = 1;
    firstDim._0_1_ = 1;
  }
  local_2eb = 0;
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00116,iVar9) + 8);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if ((uint)((ulong)uVar2 >> 0x3d) !=
      (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00117,iVar9) + 8) >> 0x3d)) {
    error(this,(TInfoSink *)symbol_local,"Layout matrix qualifier must match:",EStack_30);
    local_2eb = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar7 = *(byte *)(CONCAT44(extraout_var_x00118,iVar9) + 0x10);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if ((bVar7 & 0xf) != (*(byte *)(CONCAT44(extraout_var_x00119,iVar9) + 0x10) & 0xf)) {
    error(this,(TInfoSink *)symbol_local,"Layout packing qualifier must match:",EStack_30);
    local_2eb = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar6 = TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_x00120,iVar9));
  if (bVar6) {
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    bVar6 = TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_x00121,iVar9));
    if (bVar6) {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00122,iVar9) + 0x1c);
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      if (((uint)uVar2 & 0xfff) !=
          ((uint)*(undefined8 *)(CONCAT44(extraout_var_x00123,iVar9) + 0x1c) & 0xfff)) {
        error(this,(TInfoSink *)symbol_local,"Layout location qualifier must match:",EStack_30);
        local_2eb = 1;
      }
    }
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar18 = *(ulong *)(CONCAT44(extraout_var_x00124,iVar9) + 0x1c);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uint)(uVar18 >> 0xc) & 7) !=
      ((uint)(*(ulong *)(CONCAT44(extraout_var_x00125,iVar9) + 0x1c) >> 0xc) & 7)) {
    error(this,(TInfoSink *)symbol_local,"Layout component qualifier must match:",EStack_30);
    local_2eb = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00126,iVar9) + 0x1c);
  iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((ushort)((ulong)uVar2 >> 0x30) & 0xff) !=
      ((ushort)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00127,iVar9) + 0x1c) >> 0x30) & 0xff))
  {
    error(this,(TInfoSink *)symbol_local,"Layout index qualifier must match:",EStack_30);
    local_2eb = 1;
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar6 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var_x00128,iVar9));
  if (bVar6) {
    iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    bVar6 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var_x00129,iVar9));
    if (bVar6) {
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      uVar2 = *(undefined8 *)(CONCAT44(extraout_var_x00130,iVar9) + 0x1c);
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
      if (((uint)((ulong)uVar2 >> 0x20) & 0xffff) !=
          ((uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00131,iVar9) + 0x1c) >> 0x20) &
          0xffff)) {
        error(this,(TInfoSink *)symbol_local,"Layout binding qualifier must match:",EStack_30);
        local_2eb = 1;
      }
    }
  }
  iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar6 = TQualifier::hasBinding((TQualifier *)CONCAT44(extraout_var_x00132,iVar9));
  if (bVar6) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    iVar9 = *(int *)(CONCAT44(extraout_var_x00133,iVar9) + 0x14);
    iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (iVar9 != *(int *)(CONCAT44(extraout_var_x00134,iVar10) + 0x14)) {
      error(this,(TInfoSink *)symbol_local,"Layout offset qualifier must match:",EStack_30);
      local_2eb = 1;
    }
  }
  if ((local_2eb & 1) != 0) {
    firstDim._2_1_ = 1;
    firstDim._0_1_ = 1;
  }
  if (((firstDim._2_1_ & 1) == 0) && ((firstDim._1_1_ & 1) == 0)) {
    pTVar20 = TIntermSymbol::getConstArray(unitSymbol_local);
    bVar6 = TConstUnionArray::empty(pTVar20);
    if (!bVar6) {
      pTVar20 = TIntermSymbol::getConstArray(_unitStage);
      bVar6 = TConstUnionArray::empty(pTVar20);
      if (!bVar6) {
        pTVar20 = TIntermSymbol::getConstArray(unitSymbol_local);
        rhs = TIntermSymbol::getConstArray(_unitStage);
        bVar6 = TConstUnionArray::operator!=(pTVar20,rhs);
        if (bVar6) {
          error(this,(TInfoSink *)symbol_local,"Initializers must match:",EStack_30);
          pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
          iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32]
                  )();
          pTVar12 = TInfoSinkBase::operator<<
                              (pTVar12,(TString *)CONCAT44(extraout_var_x00135,iVar9));
          TInfoSinkBase::operator<<(pTVar12,"\n");
        }
      }
    }
  }
  if ((firstDim._2_1_ & 1) != 0) {
    iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_x00136,iVar9) + 0x38))();
    if (iVar9 == 0x10) {
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_x00137,iVar9) + 0x38))();
      if (iVar9 == 0x10) {
        iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          ();
        pTVar17 = TType::getStruct((TType *)CONCAT44(extraout_var_x00138,iVar9));
        if (pTVar17 != (TTypeList *)0x0) {
          iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          pTVar17 = TType::getStruct((TType *)CONCAT44(extraout_var_x00139,iVar9));
          if (pTVar17 != (TTypeList *)0x0) {
            if ((numDim._2_1_ & 1) != 0) {
              pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
              pcVar14 = StageName(_printQualifiers);
              pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
              pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: \"");
              iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                        [0x1e])();
              bVar4 = (byte)firstDim;
              bVar3 = numDim._3_1_;
              bVar7 = numDim._2_1_;
              iVar10 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                         [0x32])();
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              basic_string(&local_340,
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_x00141,iVar10));
              iVar10 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                         [0x1e])();
              pbVar21 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)CONCAT44(extraout_var_x00142,iVar10) + 0x28))();
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              basic_string(&local_368,pbVar21);
              TType::getCompleteString
                        (&local_318,(TType *)CONCAT44(extraout_var_x00140,iVar9),true,
                         (bool)(bVar4 & 1),(bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_340,&local_368
                        );
              pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_318);
              TInfoSinkBase::operator<<(pTVar12,"\"\n");
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_318);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_368);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_340);
              pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
              pcVar14 = StageName(EStack_30);
              pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
              pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: \"");
              iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                ();
              bVar4 = (byte)firstDim;
              bVar3 = numDim._3_1_;
              bVar7 = numDim._2_1_;
              iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                                 ();
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              basic_string(&local_3b8,
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_x00144,iVar10));
              iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                 ();
              pbVar21 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)CONCAT44(extraout_var_x00145,iVar10) + 0x28))();
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              basic_string(&local_3e0,pbVar21);
              TType::getCompleteString
                        (&local_390,(TType *)CONCAT44(extraout_var_x00143,iVar9),true,
                         (bool)(bVar4 & 1),(bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_3b8,&local_3e0
                        );
              pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_390);
              TInfoSinkBase::operator<<(pTVar12,"\"\n");
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_390);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_3e0);
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
              ~basic_string(&local_3b8);
              return;
            }
            pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
            pcVar14 = StageName(_printQualifiers);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
            iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                      [0x1e])();
            pTVar13 = (TString *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_x00146,iVar9) + 0x28))();
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12," Instance: ");
            iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                      [0x32])();
            pTVar12 = TInfoSinkBase::operator<<
                                (pTVar12,(TString *)CONCAT44(extraout_var_x00147,iVar9));
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,": \"");
            iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode
                      [0x1e])();
            bVar4 = (byte)firstDim;
            bVar3 = numDim._3_1_;
            bVar7 = numDim._2_1_;
            pool_allocator<char>::pool_allocator(&local_438);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_430,"",&local_438);
            pool_allocator<char>::pool_allocator(&local_468);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_460,"",&local_468);
            TType::getCompleteString
                      (&local_408,(TType *)CONCAT44(extraout_var_x00148,iVar9),true,
                       (bool)(bVar4 & 1),(bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_430,&local_460);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_408);
            TInfoSinkBase::operator<<(pTVar12,"\"\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_408);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_460);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_430);
            pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
            pcVar14 = StageName(EStack_30);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: Block: ");
            iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
            pTVar13 = (TString *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_x00149,iVar9) + 0x28))();
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,pTVar13);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12," Instance: ");
            iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
            pTVar12 = TInfoSinkBase::operator<<
                                (pTVar12,(TString *)CONCAT44(extraout_var_x00150,iVar9));
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,": \"");
            iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
            bVar4 = (byte)firstDim;
            bVar3 = numDim._3_1_;
            bVar7 = numDim._2_1_;
            pool_allocator<char>::pool_allocator(&local_4c0);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_4b8,"",&local_4c0);
            pool_allocator<char>::pool_allocator(&local_4f0);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &local_4e8,"",&local_4f0);
            TType::getCompleteString
                      (&local_490,(TType *)CONCAT44(extraout_var_x00151,iVar9),true,
                       (bool)(bVar4 & 1),(bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_4b8,&local_4e8);
            pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_490);
            TInfoSinkBase::operator<<(pTVar12,"\"\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_490);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_4e8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string(&local_4b8);
            return;
          }
        }
      }
    }
    if ((numDim._2_1_ & 1) == 0) {
      pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
      pcVar14 = StageName(_printQualifiers);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: ");
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,(TString *)CONCAT44(extraout_var_x00156,iVar9));
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," \"");
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      bVar4 = (byte)firstDim;
      bVar3 = numDim._3_1_;
      bVar7 = numDim._2_1_;
      pool_allocator<char>::pool_allocator(&local_648);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_640,"",&local_648);
      pool_allocator<char>::pool_allocator(&local_678);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_670,"",&local_678);
      TType::getCompleteString
                (&local_618,(TType *)CONCAT44(extraout_var_x00157,iVar9),true,(bool)(bVar4 & 1),
                 (bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_640,&local_670);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_618);
      TInfoSinkBase::operator<<(pTVar12,"\"\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_618);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_670);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_640);
      pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
      pcVar14 = StageName(EStack_30);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: ");
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,(TString *)CONCAT44(extraout_var_x00158,iVar9));
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," \"");
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      bVar4 = (byte)firstDim;
      bVar3 = numDim._3_1_;
      bVar7 = numDim._2_1_;
      pool_allocator<char>::pool_allocator(&local_6d0);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_6c8,"",&local_6d0);
      pool_allocator<char>::pool_allocator(&local_700);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_6f8,"",&local_700);
      TType::getCompleteString
                (&local_6a0,(TType *)CONCAT44(extraout_var_x00159,iVar9),true,(bool)(bVar4 & 1),
                 (bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_6c8,&local_6f8);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_6a0);
      TInfoSinkBase::operator<<(pTVar12,"\"\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_6a0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_6f8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_6c8);
    }
    else {
      pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
      pcVar14 = StageName(_printQualifiers);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: \"");
      iVar9 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      bVar4 = (byte)firstDim;
      bVar3 = numDim._3_1_;
      bVar7 = numDim._2_1_;
      iVar10 = (*(unitSymbol_local->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])()
      ;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_540,
                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_x00153,iVar10));
      pool_allocator<char>::pool_allocator(&local_570);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_568,"",&local_570);
      TType::getCompleteString
                (&local_518,(TType *)CONCAT44(extraout_var_x00152,iVar9),true,(bool)(bVar4 & 1),
                 (bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_540,&local_568);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_518);
      TInfoSinkBase::operator<<(pTVar12,"\"\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_518);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_568);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_540);
      pTVar12 = TInfoSinkBase::operator<<((TInfoSinkBase *)symbol_local,"    ");
      pcVar14 = StageName(EStack_30);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,pcVar14);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12," stage: \"");
      iVar9 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
      bVar4 = (byte)firstDim;
      bVar3 = numDim._3_1_;
      bVar7 = numDim._2_1_;
      iVar10 = (*(_unitStage->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_5c0,
                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_x00155,iVar10));
      pool_allocator<char>::pool_allocator(&local_5f0);
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_5e8,"",&local_5f0);
      TType::getCompleteString
                (&local_598,(TType *)CONCAT44(extraout_var_x00154,iVar9),true,(bool)(bVar4 & 1),
                 (bool)(bVar3 & 1),(bool)(bVar7 & 1),&local_5c0,&local_5e8);
      pTVar12 = TInfoSinkBase::operator<<(pTVar12,&local_598);
      TInfoSinkBase::operator<<(pTVar12,"\"\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_598);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_5e8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_5c0);
    }
  }
  return;
}

Assistant:

void TIntermediate::mergeErrorCheck(TInfoSink& infoSink, const TIntermSymbol& symbol, const TIntermSymbol& unitSymbol)
{
    EShLanguage stage = symbol.getStage();
    EShLanguage unitStage = unitSymbol.getStage();
    bool crossStage = stage != unitStage;
    bool writeTypeComparison = false;
    bool errorReported = false;
    bool printQualifiers = false;
    bool printPrecision = false;
    bool printType = false;

    // Types have to match
    {
        // but, we make an exception if one is an implicit array and the other is sized
        // or if the array sizes differ because of the extra array dimension on some in/out boundaries
        bool arraysMatch = false;
        if (isIoResizeArray(symbol.getType(), stage) || isIoResizeArray(unitSymbol.getType(), unitStage)) {
            // if the arrays have an extra dimension because of the stage.
            // compare dimensions while ignoring the outer dimension
            unsigned int firstDim = isIoResizeArray(symbol.getType(), stage) ? 1 : 0;
            unsigned int numDim = symbol.getArraySizes()
                ? symbol.getArraySizes()->getNumDims() : 0;
            unsigned int unitFirstDim = isIoResizeArray(unitSymbol.getType(), unitStage) ? 1 : 0;
            unsigned int unitNumDim = unitSymbol.getArraySizes()
                ? unitSymbol.getArraySizes()->getNumDims() : 0;
            arraysMatch = (numDim - firstDim) == (unitNumDim - unitFirstDim);
            // check that array sizes match as well
            for (unsigned int i = 0; i < (numDim - firstDim) && arraysMatch; i++) {
                if (symbol.getArraySizes()->getDimSize(firstDim + i) !=
                    unitSymbol.getArraySizes()->getDimSize(unitFirstDim + i)) {
                    arraysMatch = false;
                    break;
                }
            }
        }
        else {
            arraysMatch = symbol.getType().sameArrayness(unitSymbol.getType()) ||
                (symbol.getType().isArray() && unitSymbol.getType().isArray() &&
                 (symbol.getType().isImplicitlySizedArray() || unitSymbol.getType().isImplicitlySizedArray() ||
                  symbol.getType().isUnsizedArray() || unitSymbol.getType().isUnsizedArray()));
        }

        int lpidx = -1;
        int rpidx = -1;
        if (!symbol.getType().sameElementType(unitSymbol.getType(), &lpidx, &rpidx)) {
            if (lpidx >= 0 && rpidx >= 0) {
                error(infoSink, "Member names and types must match:", unitStage);
                infoSink.info << "    Block: " << symbol.getType().getTypeName() << "\n";
                infoSink.info << "        " << StageName(stage) << " stage: \""
                              << (*symbol.getType().getStruct())[lpidx].type->getCompleteString(true, false, false, true,
                                      (*symbol.getType().getStruct())[lpidx].type->getFieldName()) << "\"\n";
                infoSink.info << "        " << StageName(unitStage) << " stage: \""
                              << (*unitSymbol.getType().getStruct())[rpidx].type->getCompleteString(true, false, false, true,
                                      (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName()) << "\"\n";
                errorReported = true;
            } else if (lpidx >= 0 && rpidx == -1) {
                  TString errmsg = StageName(stage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(unitStage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                    << (*symbol.getType().getStruct())[lpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else if (lpidx == -1 && rpidx >= 0) {
                  TString errmsg = StageName(unitStage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(stage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                    << (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else {
                  error(infoSink, "Types must match:", unitStage);
                  writeTypeComparison = true;
                  printType = true;
            }
        } else if (!arraysMatch) {
            error(infoSink, "Array sizes must be compatible:", unitStage);
            writeTypeComparison = true;
            printType = true;
        } else if (!symbol.getType().sameTypeParameters(unitSymbol.getType())) {
            error(infoSink, "Type parameters must match:", unitStage);
            writeTypeComparison = true;
            printType = true;
        }
    }

    // Interface block  member-wise layout qualifiers have to match
    if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
        symbol.getType().getStruct() && unitSymbol.getType().getStruct() &&
        symbol.getType().sameStructType(unitSymbol.getType())) {
        unsigned int li = 0;
        unsigned int ri = 0;
        while (li < symbol.getType().getStruct()->size() && ri < unitSymbol.getType().getStruct()->size()) {
            if ((*symbol.getType().getStruct())[li].type->hiddenMember()) {
                ++li;
                continue;
            }
            if ((*unitSymbol.getType().getStruct())[ri].type->hiddenMember()) {
                ++ri;
                continue;
            }
            const TQualifier& qualifier = (*symbol.getType().getStruct())[li].type->getQualifier();
            const TQualifier & unitQualifier = (*unitSymbol.getType().getStruct())[ri].type->getQualifier();
            bool layoutQualifierError = false;
            if (qualifier.layoutMatrix != unitQualifier.layoutMatrix) {
                error(infoSink, "Interface block member layout matrix qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutOffset != unitQualifier.layoutOffset) {
                error(infoSink, "Interface block member layout offset qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutAlign != unitQualifier.layoutAlign) {
                error(infoSink, "Interface block member layout align qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutLocation != unitQualifier.layoutLocation) {
                error(infoSink, "Interface block member layout location qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutComponent != unitQualifier.layoutComponent) {
                error(infoSink, "Interface block member layout component qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (layoutQualifierError) {
                infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                              << (*symbol.getType().getStruct())[li].type->getFieldName() << " \""
                              << (*symbol.getType().getStruct())[li].type->getCompleteString(true, true, false, false) << "\"\n";
                infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                              << (*unitSymbol.getType().getStruct())[ri].type->getFieldName() << " \""
                              << (*unitSymbol.getType().getStruct())[ri].type->getCompleteString(true, true, false, false) << "\"\n";
                errorReported = true;
            }
            ++li;
            ++ri;
        }
    }

    bool isInOut = crossStage &&
                   ((symbol.getQualifier().storage == EvqVaryingIn && unitSymbol.getQualifier().storage == EvqVaryingOut) ||
                   (symbol.getQualifier().storage == EvqVaryingOut && unitSymbol.getQualifier().storage == EvqVaryingIn));

    // Qualifiers have to (almost) match
    // Storage...
    if (!isInOut && symbol.getQualifier().storage != unitSymbol.getQualifier().storage) {
        error(infoSink, "Storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Uniform and buffer blocks must either both have an instance name, or
    // must both be anonymous. The names don't need to match though.
    if (symbol.getQualifier().isUniformOrBuffer() &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()))) {
        error(infoSink, "Matched Uniform or Storage blocks must all be anonymous,"
                        " or all be named:", unitStage);
        writeTypeComparison = true;
    }

    if (symbol.getQualifier().storage == unitSymbol.getQualifier().storage &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()) ||
         (!IsAnonymous(symbol.getName()) && symbol.getName() != unitSymbol.getName()))) {
        warn(infoSink, "Matched shader interfaces are using different instance names.", unitStage);
        writeTypeComparison = true;
    }

    // Precision...
    if (!isInOut && symbol.getQualifier().precision != unitSymbol.getQualifier().precision) {
        error(infoSink, "Precision qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Invariance...
    if (! crossStage && symbol.getQualifier().invariant != unitSymbol.getQualifier().invariant) {
        error(infoSink, "Presence of invariant qualifier must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Precise...
    if (! crossStage && symbol.getQualifier().isNoContraction() != unitSymbol.getQualifier().isNoContraction()) {
        error(infoSink, "Presence of precise qualifier must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Auxiliary and interpolation...
    // "interpolation qualification (e.g., flat) and auxiliary qualification (e.g. centroid) may differ.
    //  These mismatches are allowed between any pair of stages ...
    //  those provided in the fragment shader supersede those provided in previous stages."
    if (!crossStage &&
        (symbol.getQualifier().centroid  != unitSymbol.getQualifier().centroid ||
        symbol.getQualifier().smooth    != unitSymbol.getQualifier().smooth ||
        symbol.getQualifier().flat      != unitSymbol.getQualifier().flat ||
        symbol.getQualifier().isSample()!= unitSymbol.getQualifier().isSample() ||
        symbol.getQualifier().isPatch() != unitSymbol.getQualifier().isPatch() ||
        symbol.getQualifier().isNonPerspective() != unitSymbol.getQualifier().isNonPerspective())) {
        error(infoSink, "Interpolation and auxiliary storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Memory...
    bool memoryQualifierError = false;
    if (symbol.getQualifier().coherent != unitSymbol.getQualifier().coherent) {
        error(infoSink, "Memory coherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().devicecoherent != unitSymbol.getQualifier().devicecoherent) {
        error(infoSink, "Memory devicecoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().queuefamilycoherent != unitSymbol.getQualifier().queuefamilycoherent) {
        error(infoSink, "Memory queuefamilycoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().workgroupcoherent != unitSymbol.getQualifier().workgroupcoherent) {
        error(infoSink, "Memory workgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().subgroupcoherent != unitSymbol.getQualifier().subgroupcoherent) {
        error(infoSink, "Memory subgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().shadercallcoherent != unitSymbol.getQualifier().shadercallcoherent) {
        error(infoSink, "Memory shadercallcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nonprivate != unitSymbol.getQualifier().nonprivate) {
        error(infoSink, "Memory nonprivate qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().volatil != unitSymbol.getQualifier().volatil) {
        error(infoSink, "Memory volatil qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nontemporal != unitSymbol.getQualifier().nontemporal) {
        error(infoSink, "Memory nontemporal qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().restrict != unitSymbol.getQualifier().restrict) {
        error(infoSink, "Memory restrict qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().readonly != unitSymbol.getQualifier().readonly) {
        error(infoSink, "Memory readonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().writeonly != unitSymbol.getQualifier().writeonly) {
        error(infoSink, "Memory writeonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (memoryQualifierError) {
          writeTypeComparison = true;
          printQualifiers = true;
    }

    // Layouts...
    // TODO: 4.4 enhanced layouts: Generalize to include offset/align: current spec
    //       requires separate user-supplied offset from actual computed offset, but
    //       current implementation only has one offset.
    bool layoutQualifierError = false;
    if (symbol.getQualifier().layoutMatrix != unitSymbol.getQualifier().layoutMatrix) {
        error(infoSink, "Layout matrix qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutPacking != unitSymbol.getQualifier().layoutPacking) {
        error(infoSink, "Layout packing qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasLocation() && unitSymbol.getQualifier().hasLocation() && symbol.getQualifier().layoutLocation != unitSymbol.getQualifier().layoutLocation) {
        error(infoSink, "Layout location qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutComponent != unitSymbol.getQualifier().layoutComponent) {
        error(infoSink, "Layout component qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutIndex != unitSymbol.getQualifier().layoutIndex) {
        error(infoSink, "Layout index qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && unitSymbol.getQualifier().hasBinding() && symbol.getQualifier().layoutBinding != unitSymbol.getQualifier().layoutBinding) {
        error(infoSink, "Layout binding qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && (symbol.getQualifier().layoutOffset != unitSymbol.getQualifier().layoutOffset)) {
        error(infoSink, "Layout offset qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (layoutQualifierError) {
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Initializers have to match, if both are present, and if we don't already know the types don't match
    if (! writeTypeComparison && ! errorReported) {
        if (! symbol.getConstArray().empty() && ! unitSymbol.getConstArray().empty()) {
            if (symbol.getConstArray() != unitSymbol.getConstArray()) {
                error(infoSink, "Initializers must match:", unitStage);
                infoSink.info << "    " << symbol.getName() << "\n";
            }
        }
    }

    if (writeTypeComparison) {
        if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
            symbol.getType().getStruct() && unitSymbol.getType().getStruct()) {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, symbol.getName(), symbol.getType().getTypeName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, unitSymbol.getName(), unitSymbol.getType().getTypeName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << " Instance: " << symbol.getName()
              << ": \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << " Instance: " << unitSymbol.getName()
              << ": \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        } else {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, symbol.getName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, unitSymbol.getName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: " << symbol.getName() << " \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: " << unitSymbol.getName() << " \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        }
    }
}